

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O1

void __thiscall
shaping_clipper::set_margin_curve(shaping_clipper *this,int (*points) [2],int num_points)

{
  int iVar1;
  pointer pfVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  float fVar10;
  
  pfVar2 = (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pfVar2 = (float)(*points)[1];
  iVar5 = 0;
  if (1 < num_points) {
    iVar4 = this->size;
    iVar6 = iVar4 / 2;
    uVar8 = 0;
    iVar5 = 0;
    do {
      iVar3 = iVar5;
      if (iVar5 <= iVar6) {
        iVar1 = points[uVar8 + 1][0];
        lVar7 = (long)iVar5 + -1;
        do {
          fVar10 = ((float)iVar5 * this->sample_rate) / (float)iVar4;
          iVar3 = iVar5;
          if ((float)iVar1 <= fVar10) break;
          pfVar2[lVar7 + 1] =
               (float)(((points[uVar8 + 1][1] - points[uVar8][1]) * ((int)fVar10 - points[uVar8][0])
                       ) / (iVar1 - points[uVar8][0]) + points[uVar8][1]);
          iVar5 = iVar5 + 1;
          lVar7 = lVar7 + 1;
          iVar3 = iVar6 + 1;
        } while (lVar7 < iVar6);
      }
      iVar5 = iVar3;
      uVar8 = uVar8 + 1;
    } while (uVar8 != num_points - 1U);
  }
  iVar4 = this->size / 2;
  if (iVar5 <= iVar4) {
    iVar6 = points[(int)(num_points - 1U)][1];
    lVar7 = 0;
    do {
      pfVar2[iVar5 + lVar7] = (float)iVar6;
      lVar7 = lVar7 + 1;
    } while ((iVar4 - iVar5) + 1 != (int)lVar7);
  }
  if (-2 < this->size) {
    lVar7 = -1;
    do {
      dVar9 = pow(10.0,(double)((this->margin_curve).
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar7 + 1] / 20.0));
      (this->margin_curve).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7 + 1] = (float)dVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->size / 2);
  }
  return;
}

Assistant:

void shaping_clipper::set_margin_curve(int points[][2], int num_points) {
    this->margin_curve[0] = points[0][1];

    int j = 0;
    for (int i = 0; i < num_points - 1; i++) {
        while (j < this->size / 2 + 1 && j * this->sample_rate / this->size < points[i + 1][0]) {
            // linearly interpolate between points
            int binHz = j * this->sample_rate / this->size;
            margin_curve[j] = points[i][1] + (binHz - points[i][0]) * (points[i + 1][1] - points[i][1]) / (points[i + 1][0] - points[i][0]);
            j++;
        }
    }
    // handle bins after the last point
    while (j < this->size / 2 + 1) {
        margin_curve[j] = points[num_points - 1][1];
        j++;
    }

    // convert margin curve to linear amplitude scale
    for (j = 0; j < this->size / 2 + 1; j++) {
        margin_curve[j] = pow(10, margin_curve[j] / 20);
    }
}